

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

uint128 google::protobuf::operator<<(uint128 *val,int amount)

{
  uint128 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  byte bVar5;
  int in_ESI;
  uint128 *in_RDI;
  uint64 new_lo;
  uint64 new_hi;
  uint128 local_10;
  
  bVar5 = (byte)in_ESI;
  if (in_ESI < 0x40) {
    if (in_ESI == 0) {
      local_10.lo_ = in_RDI->lo_;
      local_10.hi_ = in_RDI->hi_;
    }
    else {
      uVar2 = Uint128High64(in_RDI);
      uVar3 = Uint128Low64(in_RDI);
      uVar4 = Uint128Low64(in_RDI);
      uint128::uint128(&local_10,uVar2 << (bVar5 & 0x3f) | uVar3 >> (0x40 - bVar5 & 0x3f),
                       uVar4 << (bVar5 & 0x3f));
    }
  }
  else if (in_ESI < 0x80) {
    uVar2 = Uint128Low64(in_RDI);
    uint128::uint128(&local_10,uVar2 << (bVar5 - 0x40 & 0x3f),0);
  }
  else {
    uint128::uint128(&local_10,0,0);
  }
  uVar1.hi_ = local_10.hi_;
  uVar1.lo_ = local_10.lo_;
  return uVar1;
}

Assistant:

inline uint128 operator<<(const uint128& val, int amount) {
  // uint64 shifts of >= 64 are undefined, so we will need some special-casing.
  if (amount < 64) {
    if (amount == 0) {
      return val;
    }
    uint64 new_hi = (Uint128High64(val) << amount) |
                    (Uint128Low64(val) >> (64 - amount));
    uint64 new_lo = Uint128Low64(val) << amount;
    return uint128(new_hi, new_lo);
  } else if (amount < 128) {
    return uint128(Uint128Low64(val) << (amount - 64), 0);
  } else {
    return uint128(0, 0);
  }
}